

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderTGA.cpp
# Opt level: O2

IImage * __thiscall irr::video::CImageLoaderTGA::loadImage(CImageLoaderTGA *this,IReadFile *file)

{
  u16 i;
  s32 *palette;
  ulong uVar1;
  IReadFile *this_00;
  s32 *in;
  IImage *this_01;
  ulong uVar2;
  ulong uVar3;
  double __x;
  double __x_00;
  double __x_01;
  STGAHeader header;
  dimension2d<unsigned_int> local_30;
  
  this_00 = file;
  (**file->_vptr_IReadFile)(file,&header,0x12);
  if ((header.ImageWidth < 0x59d9) && (header.ImageHeight < 0x59d9)) {
    if ((ulong)header.IdLength != 0) {
      this_00 = file;
      (*file->_vptr_IReadFile[1])(file,(ulong)header.IdLength,1);
    }
    if (header.ColorMapType == '\0') {
      palette = (s32 *)0x0;
    }
    else {
      uVar3 = (ulong)header.ColorMapLength;
      uVar2 = 0x100;
      if (0x100 < header.ColorMapLength) {
        uVar2 = (ulong)header.ColorMapLength;
      }
      palette = (s32 *)operator_new__((ulong)(uint)((int)uVar2 * 4));
      uVar1 = uVar3;
      if (uVar3 < 0x100) {
        for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
          palette[uVar1] = -0xff33;
        }
      }
      uVar3 = uVar3 * (header.ColorMapEntrySize >> 3);
      this_00 = (IReadFile *)operator_new__(uVar3);
      (**file->_vptr_IReadFile)(file,this_00,uVar3);
      if (header.ColorMapEntrySize == ' ') {
        CColorConverter::convert_B8G8R8A8toA8R8G8B8(this_00,(uint)header.ColorMapLength,palette);
      }
      else if (header.ColorMapEntrySize == '\x18') {
        CColorConverter::convert_B8G8R8toA8R8G8B8(this_00,(uint)header.ColorMapLength,palette);
      }
      else if (header.ColorMapEntrySize == '\x10') {
        CColorConverter::convert_A1R5G5B5toA8R8G8B8(this_00,(uint)header.ColorMapLength,palette);
      }
      operator_delete__(this_00);
    }
    if ((byte)(header.ImageType - 1) < 3) {
      uVar2 = (ulong)((uint)(header.PixelDepth >> 3) *
                     (header._12_4_ & 0xffff) * ((uint)header._12_4_ >> 0x10));
      in = (s32 *)operator_new__(uVar2);
      (**file->_vptr_IReadFile)(file,in,uVar2);
    }
    else {
      if (header.ImageType != '\n') {
        (*file->_vptr_IReadFile[4])(file);
        os::Printer::log(__x_00);
        if (palette != (s32 *)0x0) {
          operator_delete__(palette);
        }
        goto LAB_00219072;
      }
      in = (s32 *)loadCompressedImage((CImageLoaderTGA *)this_00,file,&header);
    }
    switch((uint)header.PixelDepth << 0x1d | header.PixelDepth - 8 >> 3) {
    case 0:
      if (header.ImageType == '\x03') {
        this_01 = (IImage *)operator_new(0x50);
        local_30.Height._2_2_ = 0;
        local_30._0_6_ = CONCAT24(header.ImageHeight,header._12_4_) & 0xffff0000ffff;
        CImage::CImage((CImage *)this_01,ECF_R8G8B8,&local_30);
        CColorConverter::convert8BitTo24Bit
                  ((u8 *)in,this_01->Data,header._12_4_ & 0xffff,(uint)header._12_4_ >> 0x10,
                   (u8 *)0x0,0,(header.ImageDescriptor & 0x20) == 0);
      }
      else {
        this_01 = (IImage *)operator_new(0x50);
        if (header.ColorMapEntrySize == '\x10') {
          local_30.Height._2_2_ = 0;
          local_30._0_6_ = CONCAT24(header.ImageHeight,header._12_4_) & 0xffff0000ffff;
          CImage::CImage((CImage *)this_01,ECF_A1R5G5B5,&local_30);
          CColorConverter::convert8BitTo16Bit
                    ((u8 *)in,(s16 *)this_01->Data,header._12_4_ & 0xffff,
                     (uint)header._12_4_ >> 0x10,palette,0,(header.ImageDescriptor & 0x20) == 0);
        }
        else {
          local_30.Height._2_2_ = 0;
          local_30._0_6_ = CONCAT24(header.ImageHeight,header._12_4_) & 0xffff0000ffff;
          CImage::CImage((CImage *)this_01,ECF_A8R8G8B8,&local_30);
          CColorConverter::convert8BitTo32Bit
                    ((u8 *)in,this_01->Data,header._12_4_ & 0xffff,(uint)header._12_4_ >> 0x10,
                     (u8 *)palette,0,(header.ImageDescriptor & 0x20) == 0);
        }
      }
      break;
    case 1:
      this_01 = (IImage *)operator_new(0x50);
      local_30.Height._2_2_ = 0;
      local_30._0_6_ = CONCAT24(header.ImageHeight,header._12_4_) & 0xffff0000ffff;
      CImage::CImage((CImage *)this_01,ECF_A1R5G5B5,&local_30);
      CColorConverter::convert16BitTo16Bit
                ((s16 *)in,(s16 *)this_01->Data,header._12_4_ & 0xffff,(uint)header._12_4_ >> 0x10,0
                 ,(header.ImageDescriptor & 0x20) == 0);
      break;
    case 2:
      this_01 = (IImage *)operator_new(0x50);
      local_30.Height._2_2_ = 0;
      local_30._0_6_ = CONCAT24(header.ImageHeight,header._12_4_) & 0xffff0000ffff;
      CImage::CImage((CImage *)this_01,ECF_R8G8B8,&local_30);
      CColorConverter::convert24BitTo24Bit
                ((u8 *)in,this_01->Data,header._12_4_ & 0xffff,(uint)header._12_4_ >> 0x10,0,
                 (header.ImageDescriptor & 0x20) == 0,true);
      break;
    case 3:
      this_01 = (IImage *)operator_new(0x50);
      local_30.Height._2_2_ = 0;
      local_30._0_6_ = CONCAT24(header.ImageHeight,header._12_4_) & 0xffff0000ffff;
      CImage::CImage((CImage *)this_01,ECF_A8R8G8B8,&local_30);
      CColorConverter::convert32BitTo32Bit
                (in,(s32 *)this_01->Data,header._12_4_ & 0xffff,(uint)header._12_4_ >> 0x10,0,
                 (header.ImageDescriptor & 0x20) == 0);
      break;
    default:
      (*file->_vptr_IReadFile[4])(file);
      os::Printer::log(__x_01);
      this_01 = (IImage *)0x0;
    }
    if (in != (s32 *)0x0) {
      operator_delete__(in);
    }
    if (palette != (s32 *)0x0) {
      operator_delete__(palette);
    }
  }
  else {
    (*file->_vptr_IReadFile[4])(file);
    os::Printer::log(__x);
LAB_00219072:
    this_01 = (IImage *)0x0;
  }
  return this_01;
}

Assistant:

IImage *CImageLoaderTGA::loadImage(io::IReadFile *file) const
{
	STGAHeader header;
	u32 *palette = 0;

	file->read(&header, sizeof(STGAHeader));

#ifdef __BIG_ENDIAN__
	header.ColorMapLength = os::Byteswap::byteswap(header.ColorMapLength);
	header.ImageWidth = os::Byteswap::byteswap(header.ImageWidth);
	header.ImageHeight = os::Byteswap::byteswap(header.ImageHeight);
#endif

	if (!checkImageDimensions(header.ImageWidth, header.ImageHeight)) {
		os::Printer::log("Image dimensions too large in file", file->getFileName(), ELL_ERROR);
		return 0;
	}

	// skip image identification field
	if (header.IdLength)
		file->seek(header.IdLength, true);

	if (header.ColorMapType) {
		// Create 32 bit palette
		// `core::max_()` is not used here because it takes its inputs as references. Since `header` is packed, use the macro `MAX()` instead:
		const irr::u16 paletteSize = MAX((u16)256u, header.ColorMapLength); // ColorMapLength can lie, but so far we only use palette for 8-bit, so ensure it has 256 entries
		palette = new u32[paletteSize];

		if (paletteSize > header.ColorMapLength) {
			// To catch images using palette colors with invalid indices
			const irr::u32 errorCol = irr::video::SColor(255, 255, 0, 205).color; // bright magenta
			for (irr::u16 i = header.ColorMapLength; i < paletteSize; ++i)
				palette[i] = errorCol;
		}

		// read color map
		u8 *colorMap = new u8[header.ColorMapEntrySize / 8 * header.ColorMapLength];
		file->read(colorMap, header.ColorMapEntrySize / 8 * header.ColorMapLength);

		// convert to 32-bit palette
		switch (header.ColorMapEntrySize) {
		case 16:
			CColorConverter::convert_A1R5G5B5toA8R8G8B8(colorMap, header.ColorMapLength, palette);
			break;
		case 24:
			CColorConverter::convert_B8G8R8toA8R8G8B8(colorMap, header.ColorMapLength, palette);
			break;
		case 32:
			CColorConverter::convert_B8G8R8A8toA8R8G8B8(colorMap, header.ColorMapLength, palette);
			break;
		}
		delete[] colorMap;
	}

	// read image

	u8 *data = 0;

	if (header.ImageType == 1 ||     // Uncompressed, color-mapped images.
			header.ImageType == 2 || // Uncompressed, RGB images
			header.ImageType == 3    // Uncompressed, black and white images
	) {
		const s32 imageSize = header.ImageHeight * header.ImageWidth * (header.PixelDepth / 8);
		data = new u8[imageSize];
		file->read(data, imageSize);
	} else if (header.ImageType == 10) {
		// Runlength encoded RGB images
		data = loadCompressedImage(file, header);
	} else {
		os::Printer::log("Unsupported TGA file type", file->getFileName(), ELL_ERROR);
		delete[] palette;
		return 0;
	}

	IImage *image = 0;

	switch (header.PixelDepth) {
	case 8: {
		if (header.ImageType == 3) { // grey image
			image = new CImage(ECF_R8G8B8,
					core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
			if (image)
				CColorConverter::convert8BitTo24Bit((u8 *)data,
						(u8 *)image->getData(),
						header.ImageWidth, header.ImageHeight,
						0, 0, (header.ImageDescriptor & 0x20) == 0);
		} else {
			switch (header.ColorMapEntrySize) {
			case 16:
				image = new CImage(ECF_A1R5G5B5, core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
				if (image)
					CColorConverter::convert8BitTo16Bit((u8 *)data,
							(s16 *)image->getData(),
							header.ImageWidth, header.ImageHeight,
							(s32 *)palette, 0,
							(header.ImageDescriptor & 0x20) == 0);
				break;
			// Note: 24 bit with palette would need a 24 bit palette, too lazy doing that now (textures will prefer 32-bit later anyway)
			default:
				image = new CImage(ECF_A8R8G8B8, core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
				if (image)
					CColorConverter::convert8BitTo32Bit((u8 *)data,
							(u8 *)image->getData(),
							header.ImageWidth, header.ImageHeight,
							(u8 *)palette, 0,
							(header.ImageDescriptor & 0x20) == 0);
				break;
			}
		}
	} break;
	case 16:
		image = new CImage(ECF_A1R5G5B5,
				core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
		if (image)
			CColorConverter::convert16BitTo16Bit((s16 *)data,
					(s16 *)image->getData(), header.ImageWidth, header.ImageHeight, 0, (header.ImageDescriptor & 0x20) == 0);
		break;
	case 24:
		image = new CImage(ECF_R8G8B8,
				core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
		if (image)
			CColorConverter::convert24BitTo24Bit(
					(u8 *)data, (u8 *)image->getData(), header.ImageWidth, header.ImageHeight, 0, (header.ImageDescriptor & 0x20) == 0, true);
		break;
	case 32:
		image = new CImage(ECF_A8R8G8B8,
				core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
		if (image)
			CColorConverter::convert32BitTo32Bit((s32 *)data,
					(s32 *)image->getData(), header.ImageWidth, header.ImageHeight, 0, (header.ImageDescriptor & 0x20) == 0);
		break;
	default:
		os::Printer::log("Unsupported TGA format", file->getFileName(), ELL_ERROR);
		break;
	}

	delete[] data;
	delete[] palette;

	return image;
}